

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pBVar4;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  pointer pMVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  bool bVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  Mat shape_hints;
  int local_134;
  byte local_12d;
  int local_12c;
  Mat local_128;
  Layer *local_d8;
  long local_d0;
  uint local_c4;
  int local_c0;
  int local_bc;
  Net *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  int local_a4;
  vector<int,_std::allocator<int>_> *local_a0;
  ParamDict local_98;
  Mat local_88;
  DataReader *local_38;
  
  local_a4 = 0;
  iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_a4,4);
  if (CONCAT44(extraout_var,iVar12) == 4) {
    if (local_a4 == 0x7685dd) {
      local_bc = 0;
      local_c0 = 0;
      iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_bc,4);
      if (CONCAT44(extraout_var_00,iVar12) == 4) {
        iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
        if (CONCAT44(extraout_var_01,iVar12) == 4) {
          if ((0 < (long)local_bc) && (0 < local_c0)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_bc);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_c0);
            ParamDict::ParamDict(&local_98);
            bVar14 = 0 < local_bc;
            if (0 < local_bc) {
              local_d0 = 0;
              local_b8 = this;
              local_38 = dr;
              do {
                iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_c4,4);
                local_12d = bVar14;
                if (CONCAT44(extraout_var_02,iVar12) == 4) {
                  iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_12c,4);
                  if (CONCAT44(extraout_var_03,iVar12) != 4) {
                    load_param_bin();
                    goto LAB_0014a81c;
                  }
                  iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_134,4);
                  if (CONCAT44(extraout_var_04,iVar12) != 4) {
                    load_param_bin();
                    goto LAB_0014a81c;
                  }
                  pLVar13 = create_layer(local_c4);
                  if (pLVar13 == (Layer *)0x0) {
                    iVar12 = (*this->_vptr_Net[4])(this,(ulong)(local_c4 & 0xfffffeff));
                    pLVar13 = (Layer *)CONCAT44(extraout_var_05,iVar12);
                  }
                  if (pLVar13 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_c4);
                    fputc(10,_stderr);
                    iVar12 = 1;
                    clear(this);
                  }
                  else {
                    local_a0 = &pLVar13->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_a0,(long)local_12c);
                    bVar14 = 0 < local_12c;
                    iVar12 = 0x17;
                    local_d8 = pLVar13;
                    if (0 < local_12c) {
                      lVar15 = 0;
                      do {
                        iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_88,4);
                        if (CONCAT44(extraout_var_06,iVar12) != 4) {
                          load_param_bin();
                          iVar12 = 1;
                          break;
                        }
                        (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_88.data].consumer =
                             (int)local_d0;
                        (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar15] = (int)local_88.data;
                        lVar15 = lVar15 + 1;
                        bVar14 = lVar15 < local_12c;
                        iVar12 = 0x17;
                      } while (lVar15 < local_12c);
                    }
                    pLVar13 = local_d8;
                    if (!bVar14) {
                      local_b0 = &local_d8->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_b0,(long)local_134);
                      bVar14 = 0 < local_134;
                      iVar12 = 0x1c;
                      if (0 < local_134) {
                        lVar15 = 0;
                        do {
                          iVar12 = (*dr->_vptr_DataReader[3])(dr,&local_88,4);
                          if (CONCAT44(extraout_var_07,iVar12) != 4) {
                            load_param_bin();
                            pLVar13 = local_d8;
                            iVar12 = 1;
                            break;
                          }
                          (this->d->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)local_88.data].producer =
                               (int)local_d0;
                          (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar15] = (int)local_88.data;
                          lVar15 = lVar15 + 1;
                          bVar14 = lVar15 < local_134;
                          pLVar13 = local_d8;
                          iVar12 = 0x1c;
                        } while (lVar15 < local_134);
                      }
                      if (!bVar14) {
                        iVar12 = ParamDict::load_param_bin(&local_98,dr);
                        if (iVar12 == 0) {
                          if (pLVar13->support_int8_storage == true) {
                            (this->opt).use_vulkan_compute = false;
                          }
                          local_128.cstep = 0;
                          local_128.data = (void *)0x0;
                          local_128.refcount._0_4_ = 0;
                          local_128.refcount._4_4_ = 0;
                          local_128.elemsize._0_4_ = 0;
                          local_128.elemsize._4_4_ = 0;
                          local_128.elempack = 0;
                          local_128.h = 0;
                          local_128.d = 0;
                          local_128.c = 0;
                          local_128.allocator = (Allocator *)0x0;
                          local_128.dims = 0;
                          local_128.w = 0;
                          ParamDict::get(&local_88,&local_98,0x1e,&local_128);
                          piVar17 = (int *)CONCAT44(local_128.refcount._4_4_,
                                                    local_128.refcount._0_4_);
                          if (piVar17 != (int *)0x0) {
                            LOCK();
                            *piVar17 = *piVar17 + -1;
                            UNLOCK();
                            if (*piVar17 == 0) {
                              if (local_128.allocator == (Allocator *)0x0) {
                                if (local_128.data != (void *)0x0) {
                                  free(local_128.data);
                                }
                              }
                              else {
                                (*(local_128.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          if (((local_88.data != (void *)0x0) &&
                              ((long)local_88.c * local_88.cstep != 0)) && (0 < local_134)) {
                            piVar17 = (int *)((long)local_88.data + 0xc);
                            lVar15 = 0;
                            do {
                              iVar12 = (local_b0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar15];
                              pBVar4 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              iVar3 = piVar17[-3];
                              if (iVar3 == 3) {
LAB_0014abdb:
                                local_128.w = piVar17[-2];
                                local_128.h = piVar17[-1];
                                local_128.c = *piVar17;
                                local_128.data = (void *)0x0;
                                local_128.refcount._0_4_ = 0;
                                local_128.refcount._4_4_ = 0;
                                local_128.elemsize._0_4_ = 4;
                                local_128.elemsize._4_4_ = 0;
                                local_128.elempack = 1;
                                local_128.allocator = (Allocator *)0x0;
                                local_128.dims = 3;
                                local_128.d = 1;
                                local_128.cstep =
                                     (long)local_128.h * (long)local_128.w + 3U & 0x3ffffffffffffffc
                                ;
                                if (&pBVar4[iVar12].shape != &local_128) {
                                  piVar5 = pBVar4[iVar12].shape.refcount;
                                  if (piVar5 != (int *)0x0) {
                                    LOCK();
                                    *piVar5 = *piVar5 + -1;
                                    UNLOCK();
                                    if (*piVar5 == 0) {
                                      pvVar6 = pBVar4[iVar12].shape.data;
                                      pAVar7 = pBVar4[iVar12].shape.allocator;
                                      if (pAVar7 == (Allocator *)0x0) {
                                        if (pvVar6 != (void *)0x0) {
                                          free(pvVar6);
                                        }
                                      }
                                      else {
                                        (*pAVar7->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar4[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.elemsize + 4) = 0;
                                  pBVar4[iVar12].shape.data = (void *)0x0;
                                  pBVar4[iVar12].shape.refcount = (int *)0x0;
                                  pBVar4[iVar12].shape.dims = 0;
                                  pBVar4[iVar12].shape.w = 0;
                                  pBVar4[iVar12].shape.h = 0;
                                  pBVar4[iVar12].shape.d = 0;
                                  pBVar4[iVar12].shape.c = 0;
                                  pBVar4[iVar12].shape.data = local_128.data;
                                  pBVar4[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_128.refcount._4_4_,
                                                       local_128.refcount._0_4_);
                                  pBVar4[iVar12].shape.elemsize =
                                       CONCAT44(local_128.elemsize._4_4_,
                                                (undefined4)local_128.elemsize);
                                  pBVar4[iVar12].shape.elempack = local_128.elempack;
                                  pBVar4[iVar12].shape.allocator = local_128.allocator;
                                  pBVar4[iVar12].shape.dims = local_128.dims;
                                  pBVar4[iVar12].shape.w = local_128.w;
                                  pBVar4[iVar12].shape.h = local_128.h;
                                  pBVar4[iVar12].shape.d = local_128.d;
                                  pBVar4[iVar12].shape.c = local_128.c;
                                  pBVar4[iVar12].shape.cstep = local_128.cstep;
                                }
                                piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,
                                                         local_128.refcount._0_4_);
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    if (local_128.allocator == (Allocator *)0x0) {
                                      if (local_128.data != (void *)0x0) {
                                        free(local_128.data);
                                      }
                                    }
                                    else {
                                      (*(local_128.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                              }
                              else if (iVar3 == 2) {
                                local_128.w = piVar17[-2];
                                local_128.h = piVar17[-1];
                                local_128.data = (void *)0x0;
                                local_128.refcount._0_4_ = 0;
                                local_128.refcount._4_4_ = 0;
                                local_128.elemsize._0_4_ = 4;
                                local_128.elemsize._4_4_ = 0;
                                local_128.elempack = 1;
                                local_128.allocator = (Allocator *)0x0;
                                local_128.dims = 2;
                                local_128.d = 1;
                                local_128.c = 1;
                                local_128.cstep = (long)local_128.h * (long)local_128.w;
                                if (&pBVar4[iVar12].shape != &local_128) {
                                  piVar5 = pBVar4[iVar12].shape.refcount;
                                  if (piVar5 != (int *)0x0) {
                                    LOCK();
                                    *piVar5 = *piVar5 + -1;
                                    UNLOCK();
                                    if (*piVar5 == 0) {
                                      pvVar6 = pBVar4[iVar12].shape.data;
                                      pAVar7 = pBVar4[iVar12].shape.allocator;
                                      if (pAVar7 == (Allocator *)0x0) {
                                        if (pvVar6 != (void *)0x0) {
                                          free(pvVar6);
                                        }
                                      }
                                      else {
                                        (*pAVar7->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar4[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.elemsize + 4) = 0;
                                  pBVar4[iVar12].shape.data = (void *)0x0;
                                  pBVar4[iVar12].shape.refcount = (int *)0x0;
                                  pBVar4[iVar12].shape.dims = 0;
                                  pBVar4[iVar12].shape.w = 0;
                                  pBVar4[iVar12].shape.h = 0;
                                  pBVar4[iVar12].shape.d = 0;
                                  pBVar4[iVar12].shape.c = 0;
                                  pBVar4[iVar12].shape.data = local_128.data;
                                  pBVar4[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_128.refcount._4_4_,
                                                       local_128.refcount._0_4_);
                                  pBVar4[iVar12].shape.elemsize =
                                       CONCAT44(local_128.elemsize._4_4_,
                                                (undefined4)local_128.elemsize);
                                  pBVar4[iVar12].shape.elempack = local_128.elempack;
                                  pBVar4[iVar12].shape.allocator = local_128.allocator;
                                  pBVar4[iVar12].shape.dims = local_128.dims;
                                  pBVar4[iVar12].shape.w = local_128.w;
                                  pBVar4[iVar12].shape.h = local_128.h;
                                  pBVar4[iVar12].shape.d = local_128.d;
                                  pBVar4[iVar12].shape.c = local_128.c;
                                  pBVar4[iVar12].shape.cstep = local_128.cstep;
                                }
                                this = local_b8;
                                piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,
                                                         local_128.refcount._0_4_);
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    if (local_128.allocator == (Allocator *)0x0) {
                                      if (local_128.data != (void *)0x0) {
                                        free(local_128.data);
                                      }
                                    }
                                    else {
                                      (*(local_128.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
LAB_0014abd2:
                                if (iVar3 == 3) goto LAB_0014abdb;
                              }
                              else if (iVar3 == 1) {
                                local_128.w = piVar17[-2];
                                local_128.cstep = (size_t)local_128.w;
                                local_128.data = (void *)0x0;
                                local_128.refcount._0_4_ = 0;
                                local_128.refcount._4_4_ = 0;
                                local_128.elemsize._0_4_ = 4;
                                local_128.elemsize._4_4_ = 0;
                                local_128.elempack = 1;
                                local_128.allocator = (Allocator *)0x0;
                                local_128.dims = 1;
                                local_128.h = 1;
                                local_128.d = 1;
                                local_128.c = 1;
                                if (&pBVar4[iVar12].shape != &local_128) {
                                  piVar5 = pBVar4[iVar12].shape.refcount;
                                  if (piVar5 != (int *)0x0) {
                                    LOCK();
                                    *piVar5 = *piVar5 + -1;
                                    UNLOCK();
                                    if (*piVar5 == 0) {
                                      pvVar6 = pBVar4[iVar12].shape.data;
                                      pAVar7 = pBVar4[iVar12].shape.allocator;
                                      if (pAVar7 == (Allocator *)0x0) {
                                        if (pvVar6 != (void *)0x0) {
                                          free(pvVar6);
                                        }
                                      }
                                      else {
                                        (*pAVar7->_vptr_Allocator[3])();
                                      }
                                    }
                                  }
                                  pBVar4[iVar12].shape.cstep = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.refcount + 4) = 0;
                                  *(undefined8 *)((long)&pBVar4[iVar12].shape.elemsize + 4) = 0;
                                  pBVar4[iVar12].shape.data = (void *)0x0;
                                  pBVar4[iVar12].shape.refcount = (int *)0x0;
                                  pBVar4[iVar12].shape.dims = 0;
                                  pBVar4[iVar12].shape.w = 0;
                                  pBVar4[iVar12].shape.h = 0;
                                  pBVar4[iVar12].shape.d = 0;
                                  pBVar4[iVar12].shape.c = 0;
                                  pBVar4[iVar12].shape.data = local_128.data;
                                  pBVar4[iVar12].shape.refcount =
                                       (int *)CONCAT44(local_128.refcount._4_4_,
                                                       local_128.refcount._0_4_);
                                  pBVar4[iVar12].shape.elemsize =
                                       CONCAT44(local_128.elemsize._4_4_,
                                                (undefined4)local_128.elemsize);
                                  pBVar4[iVar12].shape.elempack = local_128.elempack;
                                  pBVar4[iVar12].shape.allocator = local_128.allocator;
                                  pBVar4[iVar12].shape.dims = local_128.dims;
                                  pBVar4[iVar12].shape.w = local_128.w;
                                  pBVar4[iVar12].shape.h = local_128.h;
                                  pBVar4[iVar12].shape.d = local_128.d;
                                  pBVar4[iVar12].shape.c = local_128.c;
                                  pBVar4[iVar12].shape.cstep = local_128.cstep;
                                }
                                this = local_b8;
                                piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,
                                                         local_128.refcount._0_4_);
                                if (piVar5 != (int *)0x0) {
                                  LOCK();
                                  *piVar5 = *piVar5 + -1;
                                  UNLOCK();
                                  if (*piVar5 == 0) {
                                    if (local_128.allocator == (Allocator *)0x0) {
                                      if (local_128.data != (void *)0x0) {
                                        free(local_128.data);
                                      }
                                    }
                                    else {
                                      (*(local_128.allocator)->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                goto LAB_0014abd2;
                              }
                              lVar15 = lVar15 + 1;
                              piVar17 = piVar17 + 4;
                            } while (lVar15 < local_134);
                          }
                          local_128.d = 0;
                          local_128.h = 0;
                          local_128.w = 0;
                          local_128.dims = 0;
                          local_128.elempack = 0;
                          local_128.elemsize._4_4_ = 0;
                          local_128.elemsize._0_4_ = 0;
                          local_128.refcount._4_4_ = 0;
                          local_128.refcount._0_4_ = 0;
                          local_128.cstep = 0;
                          local_128.c = 0;
                          local_128.data = (void *)0x0;
                          pvVar1 = &local_d8->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_12c);
                          if (0 < local_12c) {
                            lVar15 = 0;
                            lVar16 = 0;
                            do {
                              iVar12 = (local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar16];
                              pBVar4 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar8 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar15);
                              if ((Mat *)puVar2 != &pBVar4[iVar12].shape) {
                                piVar17 = pBVar4[iVar12].shape.refcount;
                                if (piVar17 != (int *)0x0) {
                                  LOCK();
                                  *piVar17 = *piVar17 + 1;
                                  UNLOCK();
                                }
                                piVar17 = *(int **)((long)&pMVar8->refcount + lVar15);
                                if (piVar17 != (int *)0x0) {
                                  LOCK();
                                  *piVar17 = *piVar17 + -1;
                                  UNLOCK();
                                  if (*piVar17 == 0) {
                                    pvVar6 = *(void **)((long)&pMVar8->data + lVar15);
                                    plVar9 = *(long **)((long)&pMVar8->allocator + lVar15);
                                    if (plVar9 == (long *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar9 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar8->cstep + lVar15) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar15);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar8->c + lVar15) = 0;
                                piVar17 = pBVar4[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar15);
                                *puVar2 = pBVar4[iVar12].shape.data;
                                puVar2[1] = piVar17;
                                *(size_t *)((long)&pMVar8->elemsize + lVar15) =
                                     pBVar4[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar8->elempack + lVar15) =
                                     pBVar4[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar8->allocator + lVar15) =
                                     pBVar4[iVar12].shape.allocator;
                                iVar3 = pBVar4[iVar12].shape.w;
                                iVar10 = pBVar4[iVar12].shape.h;
                                iVar11 = pBVar4[iVar12].shape.d;
                                piVar17 = (int *)((long)&pMVar8->dims + lVar15);
                                *piVar17 = pBVar4[iVar12].shape.dims;
                                piVar17[1] = iVar3;
                                piVar17[2] = iVar10;
                                piVar17[3] = iVar11;
                                *(int *)((long)&pMVar8->c + lVar15) = pBVar4[iVar12].shape.c;
                                *(size_t *)((long)&pMVar8->cstep + lVar15) =
                                     pBVar4[iVar12].shape.cstep;
                              }
                              lVar16 = lVar16 + 1;
                              lVar15 = lVar15 + 0x48;
                              this = local_b8;
                            } while (lVar16 < local_12c);
                          }
                          pvVar1 = &local_d8->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_134);
                          if (0 < local_134) {
                            lVar15 = 0;
                            lVar16 = 0;
                            do {
                              iVar12 = (local_b0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar16];
                              pBVar4 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar8 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar8->data + lVar15);
                              if ((Mat *)puVar2 != &pBVar4[iVar12].shape) {
                                piVar17 = pBVar4[iVar12].shape.refcount;
                                if (piVar17 != (int *)0x0) {
                                  LOCK();
                                  *piVar17 = *piVar17 + 1;
                                  UNLOCK();
                                }
                                piVar17 = *(int **)((long)&pMVar8->refcount + lVar15);
                                if (piVar17 != (int *)0x0) {
                                  LOCK();
                                  *piVar17 = *piVar17 + -1;
                                  UNLOCK();
                                  if (*piVar17 == 0) {
                                    pvVar6 = *(void **)((long)&pMVar8->data + lVar15);
                                    plVar9 = *(long **)((long)&pMVar8->allocator + lVar15);
                                    if (plVar9 == (long *)0x0) {
                                      if (pvVar6 != (void *)0x0) {
                                        free(pvVar6);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar9 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar8->cstep + lVar15) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar15);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar8->c + lVar15) = 0;
                                piVar17 = pBVar4[iVar12].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar8->data + lVar15);
                                *puVar2 = pBVar4[iVar12].shape.data;
                                puVar2[1] = piVar17;
                                *(size_t *)((long)&pMVar8->elemsize + lVar15) =
                                     pBVar4[iVar12].shape.elemsize;
                                *(int *)((long)&pMVar8->elempack + lVar15) =
                                     pBVar4[iVar12].shape.elempack;
                                *(Allocator **)((long)&pMVar8->allocator + lVar15) =
                                     pBVar4[iVar12].shape.allocator;
                                iVar3 = pBVar4[iVar12].shape.w;
                                iVar10 = pBVar4[iVar12].shape.h;
                                iVar11 = pBVar4[iVar12].shape.d;
                                piVar17 = (int *)((long)&pMVar8->dims + lVar15);
                                *piVar17 = pBVar4[iVar12].shape.dims;
                                piVar17[1] = iVar3;
                                piVar17[2] = iVar10;
                                piVar17[3] = iVar11;
                                *(int *)((long)&pMVar8->c + lVar15) = pBVar4[iVar12].shape.c;
                                *(size_t *)((long)&pMVar8->cstep + lVar15) =
                                     pBVar4[iVar12].shape.cstep;
                              }
                              lVar16 = lVar16 + 1;
                              lVar15 = lVar15 + 0x48;
                              this = local_b8;
                            } while (lVar16 < local_134);
                          }
                          pLVar13 = local_d8;
                          iVar12 = (*local_d8->_vptr_Layer[2])(local_d8,&local_98);
                          dr = local_38;
                          if (iVar12 == 0) {
                            (this->d->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_d0] = pLVar13;
                            iVar12 = 0;
                          }
                          else {
                            load_param_bin();
                            iVar12 = 0xe;
                          }
                          piVar17 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_)
                          ;
                          if (piVar17 != (int *)0x0) {
                            LOCK();
                            *piVar17 = *piVar17 + -1;
                            UNLOCK();
                            if (*piVar17 == 0) {
                              if (local_88.allocator == (Allocator *)0x0) {
                                if (local_88.data != (void *)0x0) {
                                  free(local_88.data);
                                }
                              }
                              else {
                                (*(local_88.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_88.cstep = 0;
                          local_88.data = (void *)0x0;
                          local_88.refcount._0_4_ = 0;
                          local_88.refcount._4_4_ = 0;
                          local_88.elemsize._0_4_ = 0;
                          local_88._20_8_ = 0;
                          local_88.dims = 0;
                          local_88.w = 0;
                          local_88.h = 0;
                          local_88.d = 0;
                          local_88.c = 0;
                        }
                        else {
                          load_param_bin();
                          iVar12 = 0xe;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param_bin();
LAB_0014a81c:
                  iVar12 = 1;
                }
                if ((iVar12 != 0xe) && (iVar12 != 0)) {
                  iVar12 = -1;
                  if ((local_12d & 1) != 0) goto LAB_0014b09a;
                  break;
                }
                local_d0 = local_d0 + 1;
                bVar14 = local_d0 < local_bc;
              } while (local_d0 < local_bc);
            }
            iVar12 = 0;
            NetPrivate::update_input_output_indexes(this->d);
LAB_0014b09a:
            ParamDict::~ParamDict(&local_98);
            return iVar12;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}